

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void ndiSetThreadMode(ndicapi *pol,bool mode)

{
  bool mode_local;
  ndicapi *pol_local;
  
  if ((((pol->IsThreadedMode & 1U) == 0) || (!mode)) &&
     (((pol->IsThreadedMode & 1U) != 0 || (mode)))) {
    pol->IsThreadedMode = mode;
    if (mode) {
      ndiSpawnThread(pol);
    }
    else {
      ndiJoinThread(pol);
    }
  }
  return;
}

Assistant:

ndicapiExport void ndiSetThreadMode(ndicapi* pol, bool mode)
{
  if ((pol->IsThreadedMode && mode) || (!pol->IsThreadedMode && !mode))
  {
    return;
  }

  pol->IsThreadedMode = mode;

  if (mode)
  {
    ndiSpawnThread(pol);
  }
  else
  {
    ndiJoinThread(pol);
  }
}